

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
               *this,int i)

{
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar1;
  Fad<double> *pFVar2;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar4;
  value_type vVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double local_58;
  double dStack_50;
  
  vVar5 = FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  pFVar1 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  dVar6 = sinh(((pFVar1->fadexpr_).left_.constant_ * ((pFVar1->fadexpr_).right_)->val_) /
               (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar1 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pFVar2 = (pFVar1->fadexpr_).right_;
  dVar7 = (pFVar1->fadexpr_).left_.constant_;
  auVar9._0_8_ = (pFVar2->dx_).ptr_to_data[i] * dVar7;
  dVar8 = (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_;
  dVar7 = cosh((dVar7 * pFVar2->val_) / dVar8);
  pFVar3 = (this->left_->fadexpr_).left_;
  pFVar4 = (this->left_->fadexpr_).right_;
  pFVar1 = (pFVar4->fadexpr_).expr_.fadexpr_.left_;
  auVar9._8_8_ = ((pFVar3->fadexpr_).left_)->val_;
  auVar10._8_8_ = ((pFVar3->fadexpr_).right_)->val_;
  auVar10._0_8_ = dVar8;
  auVar10 = divpd(auVar9,auVar10);
  dVar8 = cos(((pFVar1->fadexpr_).left_.constant_ * ((pFVar1->fadexpr_).right_)->val_) /
              (pFVar4->fadexpr_).expr_.fadexpr_.right_.constant_);
  local_58 = auVar10._0_8_;
  dStack_50 = auVar10._8_8_;
  return dVar6 * vVar5 + dVar8 * dStack_50 * dVar7 * local_58;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}